

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine_p.h
# Opt level: O0

void __thiscall
QOpenGL2PaintEngineExPrivate::QOpenGL2PaintEngineExPrivate
          (QOpenGL2PaintEngineExPrivate *this,QOpenGL2PaintEngineEx *q_ptr)

{
  QTriangulatingStroker *in_RSI;
  QPaintEngineExPrivate *in_RDI;
  QOpenGLVertexArrayObject *unaff_retaddr;
  QPaintEngineExPrivate *parent;
  Type type;
  
  parent = in_RDI;
  QPaintEngineExPrivate::QPaintEngineExPrivate(in_RDI);
  *(undefined ***)in_RDI = &PTR__QOpenGL2PaintEngineExPrivate_00213be8;
  QOpenGLExtensions::QOpenGLExtensions((QOpenGLExtensions *)(in_RDI + 0x220));
  *(QTriangulatingStroker **)(in_RDI + 0x228) = in_RSI;
  *(undefined8 *)(in_RDI + 0x230) = 0;
  *(undefined4 *)(in_RDI + 0x240) = 0;
  *(undefined4 *)(in_RDI + 0x244) = 0;
  QPointer<QOpenGLContext>::QPointer((QPointer<QOpenGLContext> *)in_RSI,in_RDI);
  in_RDI[0x26a] = (QPaintEngineExPrivate)0x1;
  QRegion::QRegion((QRegion *)(in_RDI + 0x270));
  QRect::QRect((QRect *)in_RSI);
  QBrush::QBrush((QBrush *)(in_RDI + 0x290));
  QBrush::QBrush((QBrush *)(in_RDI + 0x298));
  QImage::QImage((QImage *)(in_RDI + 0x2a0));
  QOpenGL2PEXVertexArray::QOpenGL2PEXVertexArray((QOpenGL2PEXVertexArray *)in_RSI);
  QOpenGL2PEXVertexArray::QOpenGL2PEXVertexArray((QOpenGL2PEXVertexArray *)in_RSI);
  QList<unsigned_short>::QList((QList<unsigned_short> *)0x169364);
  *(undefined4 *)(in_RDI + 0x360) = 0;
  QDataBuffer<float>::QDataBuffer(&in_RSI->m_vertices,(qsizetype)in_RDI);
  in_RDI[0x3c0] = (QPaintEngineExPrivate)0x0;
  in_RDI[0x3c1] = (QPaintEngineExPrivate)0x0;
  *(undefined4 *)(in_RDI + 1000) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x3ec) = 0xffffffff;
  QOpenGLVertexArrayObject::QOpenGLVertexArrayObject(unaff_retaddr,(QObject *)parent);
  type = (Type)((ulong)parent >> 0x20);
  QOpenGLBuffer::QOpenGLBuffer((QOpenGLBuffer *)unaff_retaddr,type);
  QOpenGLBuffer::QOpenGLBuffer((QOpenGLBuffer *)unaff_retaddr,type);
  QOpenGLBuffer::QOpenGLBuffer((QOpenGLBuffer *)unaff_retaddr,type);
  QOpenGLBuffer::QOpenGLBuffer((QOpenGLBuffer *)unaff_retaddr,type);
  QTriangulatingStroker::QTriangulatingStroker(in_RSI);
  QDashedStrokeProcessor::QDashedStrokeProcessor((QDashedStrokeProcessor *)(in_RDI + 0x498));
  QVarLengthArray<unsigned_int,_8LL>::QVarLengthArray
            ((QVarLengthArray<unsigned_int,_8LL> *)(in_RDI + 0x578));
  QVarLengthArray<unsigned_int,_8LL>::QVarLengthArray
            ((QVarLengthArray<unsigned_int,_8LL> *)(in_RDI + 0x5b0));
  return;
}

Assistant:

QOpenGL2PaintEngineExPrivate(QOpenGL2PaintEngineEx *q_ptr) :
            q(q_ptr),
            shaderManager(nullptr),
            width(0), height(0),
            ctx(nullptr),
            useSystemClip(true),
            elementIndicesVBOId(0),
            opacityArray(0),
            snapToPixelGrid(false),
            nativePaintingActive(false),
            inverseScale(1),
            lastTextureUnitUsed(QT_UNKNOWN_TEXTURE_UNIT),
            vertexBuffer(QOpenGLBuffer::VertexBuffer),
            texCoordBuffer(QOpenGLBuffer::VertexBuffer),
            opacityBuffer(QOpenGLBuffer::VertexBuffer),
            indexBuffer(QOpenGLBuffer::IndexBuffer)
    { }